

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RatioSequence.cpp
# Opt level: O2

RatioSequence *
RatioSequence::interleave
          (RatioSequence *__return_storage_ptr__,RatioSequence *rs1,RatioSequence *rs2)

{
  vector<Ratio,_std::allocator<Ratio>_> *this;
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  RatioSequence combined2;
  RatioSequence combined1;
  RatioSequence local_80;
  RatioSequence local_60;
  RatioSequence *local_40;
  double local_38;
  
  getNonDesRSWithMinDist(&local_60,rs1);
  getNonDesRSWithMinDist(&local_80,rs2);
  (__return_storage_ptr__->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->combineCode = 0;
  (__return_storage_ptr__->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  this = &__return_storage_ptr__->_RatioSequence;
  std::vector<Ratio,_std::allocator<Ratio>_>::reserve
            (this,((long)local_80._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_80._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 6) +
                  ((long)local_60._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_60._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 6));
  lVar1 = 0;
  uVar4 = 0;
  uVar3 = 0;
  local_40 = __return_storage_ptr__;
  do {
    lVar2 = uVar3 << 6;
    while( true ) {
      if (((ulong)((long)local_60._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_60._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 6) <= uVar4) ||
         ((ulong)((long)local_80._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_80._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 6) <= uVar3)) {
        for (; uVar4 < (ulong)((long)local_60._RatioSequence.
                                     super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)local_60._RatioSequence.
                                     super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 6); uVar4 = uVar4 + 1) {
          std::vector<Ratio,_std::allocator<Ratio>_>::push_back
                    (this,(value_type *)
                          ((long)&(local_60._RatioSequence.
                                   super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                   super__Vector_impl_data._M_start)->eLength + lVar1));
          lVar1 = lVar1 + 0x40;
        }
        for (; uVar3 < (ulong)((long)local_80._RatioSequence.
                                     super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)local_80._RatioSequence.
                                     super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 6); uVar3 = uVar3 + 1) {
          std::vector<Ratio,_std::allocator<Ratio>_>::push_back
                    (this,(value_type *)
                          ((long)&(local_80._RatioSequence.
                                   super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                   super__Vector_impl_data._M_start)->eLength + lVar2));
          lVar2 = lVar2 + 0x40;
        }
        std::vector<Ratio,_std::allocator<Ratio>_>::~vector(&local_80._RatioSequence);
        std::vector<Ratio,_std::allocator<Ratio>_>::~vector(&local_60._RatioSequence);
        return local_40;
      }
      local_38 = Ratio::getRatio(local_60._RatioSequence.
                                 super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                                 super__Vector_impl_data._M_start + uVar4);
      dVar5 = Ratio::getRatio((Ratio *)((long)&(local_80._RatioSequence.
                                                super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                                                _M_impl.super__Vector_impl_data._M_start)->eLength +
                                       lVar2));
      if (local_38 <= dVar5) break;
      std::vector<Ratio,_std::allocator<Ratio>_>::push_back
                (this,(value_type *)
                      ((long)&(local_80._RatioSequence.
                               super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
                               super__Vector_impl_data._M_start)->eLength + lVar2));
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x40;
    }
    std::vector<Ratio,_std::allocator<Ratio>_>::push_back
              (this,local_60._RatioSequence.super__Vector_base<Ratio,_std::allocator<Ratio>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar4);
    uVar4 = uVar4 + 1;
    lVar1 = lVar1 + 0x40;
  } while( true );
}

Assistant:

RatioSequence RatioSequence::interleave(RatioSequence& rs1, RatioSequence& rs2) {
    RatioSequence combined1 = rs1.getNonDesRSWithMinDist();
    RatioSequence combined2 = rs2.getNonDesRSWithMinDist();

    RatioSequence interleavedRS = RatioSequence();
    interleavedRS._RatioSequence.reserve(combined1.size() + combined2.size());
    size_t index1 = 0;  // index for stepping through combined1
    size_t index2 = 0;  // index for stepping through combined2
    while (index1 < combined1.size() && index2 < combined2.size()) {
        if (combined1[index1].getRatio() <= combined2[index2].getRatio()) {
            interleavedRS.push_back(combined1[index1]);
            index1++;
        } else {
            interleavedRS.push_back(combined2[index2]);
            index2++;
        }
    }
    // if we have finished adding rs2 but not rs1
    while (index1 < combined1.size()) {
        interleavedRS.push_back(combined1[index1]);
        index1++;
    }
    // if we have finished adding rs1 but not rs2
    while (index2 < combined2.size()) {
        interleavedRS.push_back(combined2[index2]);
        index2++;
    }
    return interleavedRS;
}